

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bracket_notation_parser_impl.h
# Opt level: O1

void __thiscall
parser::BracketNotationParser<label::JSONLabel>::parse_collection
          (BracketNotationParser<label::JSONLabel> *this,
          vector<node::Node<label::JSONLabel>,_std::allocator<node::Node<label::JSONLabel>_>_>
          *trees_collection,string *file_path)

{
  char cVar1;
  bool bVar2;
  istream *piVar3;
  runtime_error *this_00;
  long *plVar4;
  pointer pNVar5;
  string tree_string;
  ifstream trees_file;
  string local_298;
  undefined1 local_278 [24];
  _Alloc_hider _Stack_260;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_250;
  long local_238 [4];
  byte abStack_218 [488];
  
  std::ifstream::ifstream((istream *)local_238,(string *)file_path,_S_in);
  if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 5) == 0) {
    local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
    local_298._M_string_length = 0;
    local_298.field_2._M_local_buf[0] = '\0';
    while( true ) {
      cVar1 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) +
                              (char)(istream *)local_238);
      piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_238,(string *)&local_298,cVar1);
      if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) break;
      bVar2 = validate_input(this,&local_298);
      if (bVar2) {
        parse_single((Node<label::JSONLabel> *)local_278,this,&local_298);
        std::vector<node::Node<label::JSONLabel>,std::allocator<node::Node<label::JSONLabel>>>::
        emplace_back<node::Node<label::JSONLabel>>
                  ((vector<node::Node<label::JSONLabel>,std::allocator<node::Node<label::JSONLabel>>>
                    *)trees_collection,(Node<label::JSONLabel> *)local_278);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Stack_260._M_p != &local_250) {
          operator_delete(_Stack_260._M_p,local_250._M_allocated_capacity + 1);
        }
        std::vector<node::Node<label::JSONLabel>,_std::allocator<node::Node<label::JSONLabel>_>_>::
        ~vector((vector<node::Node<label::JSONLabel>,_std::allocator<node::Node<label::JSONLabel>_>_>
                 *)local_278);
      }
    }
    std::ifstream::close();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p != &local_298.field_2) {
      operator_delete(local_298._M_dataplus._M_p,
                      CONCAT71(local_298.field_2._M_allocated_capacity._1_7_,
                               local_298.field_2._M_local_buf[0]) + 1);
    }
    std::ifstream::~ifstream(local_238);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_298,"ERROR: Problem with opening the file \'",file_path);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_298);
  local_278._0_8_ = *plVar4;
  pNVar5 = (pointer)(plVar4 + 2);
  if ((pointer)local_278._0_8_ == pNVar5) {
    local_278._16_8_ =
         (pNVar5->children_).
         super__Vector_base<node::Node<label::JSONLabel>,_std::allocator<node::Node<label::JSONLabel>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    _Stack_260._M_p = (pointer)plVar4[3];
    local_278._0_8_ = (pointer)(local_278 + 0x10);
  }
  else {
    local_278._16_8_ =
         (pNVar5->children_).
         super__Vector_base<node::Node<label::JSONLabel>,_std::allocator<node::Node<label::JSONLabel>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
  }
  local_278._8_8_ = plVar4[1];
  *plVar4 = (long)pNVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::runtime_error::runtime_error(this_00,(string *)local_278);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void BracketNotationParser<Label>::parse_collection(
    std::vector<node::Node<Label>>& trees_collection,
    const std::string& file_path) {
  std::ifstream trees_file(file_path);
  if (!trees_file) {
    throw std::runtime_error("ERROR: Problem with opening the file '" + file_path + "' in BracketNotationParser::parse_collection_efficient.");
  }
  // Read the trees line by line, parse, and move into the container.
  std::string tree_string;
  while (std::getline(trees_file, tree_string)) {
    if (!validate_input(tree_string)) {
      continue;
    }
    trees_collection.push_back(parse_single(tree_string)); // -> This invokes a move constructor (due to push_back(<rvalue>)).
  }
  trees_file.close();
}